

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O1

void Qentem::Memory::Sort<false,unsigned_int,unsigned_int>(uint *arr,uint start,uint end)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  while (start != end) {
    uVar1 = start + 1;
    uVar3 = start;
    if (uVar1 < end) {
      lVar2 = 0;
      uVar4 = (ulong)start;
      do {
        if (arr[start] < arr[(ulong)uVar1 + lVar2]) {
          uVar4 = (ulong)((int)uVar4 + 1);
          uVar3 = arr[uVar4];
          arr[uVar4] = arr[(ulong)uVar1 + lVar2];
          arr[(ulong)uVar1 + lVar2] = uVar3;
        }
        uVar3 = (uint)uVar4;
        lVar2 = lVar2 + 1;
      } while ((end - 1) - start != (int)lVar2);
    }
    if (uVar3 != start) {
      uVar1 = arr[uVar3];
      arr[uVar3] = arr[start];
      arr[start] = uVar1;
    }
    Sort<false,unsigned_int,unsigned_int>(arr,start,uVar3);
    start = uVar3 + 1;
  }
  return;
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}